

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::InputScalar(char *label,ImGuiDataType data_type,void *p_data,void *p_step,
                       void *p_step_fast,char *format,ImGuiInputTextFlags flags)

{
  bool bVar1;
  float fVar2;
  ImGuiWindow *pIVar3;
  char *pcVar4;
  void *in_RCX;
  void *in_RDX;
  float in_ESI;
  char *in_RDI;
  void *in_R8;
  long in_R9;
  float _x;
  float fVar5;
  ImGuiTextFlags in_stack_00000024;
  char *in_stack_00000028;
  char *in_stack_00000030;
  char *label_end;
  ImGuiButtonFlags button_flags;
  ImVec2 backup_frame_padding;
  float button_size;
  bool value_changed;
  char buf [64];
  ImGuiStyle *style;
  ImGuiContext *g;
  ImGuiWindow *window;
  void *in_stack_fffffffffffffef8;
  float in_stack_ffffffffffffff00;
  float in_stack_ffffffffffffff04;
  char *in_stack_ffffffffffffff08;
  char *in_stack_ffffffffffffff10;
  void *in_stack_ffffffffffffff18;
  int in_stack_ffffffffffffff20;
  float in_stack_ffffffffffffff24;
  void *in_stack_ffffffffffffff28;
  ImGuiInputTextCallback in_stack_ffffffffffffff30;
  undefined8 in_stack_ffffffffffffff38;
  ImGuiInputTextFlags flags_00;
  size_t in_stack_ffffffffffffff40;
  char *in_stack_ffffffffffffff48;
  float in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  char *in_stack_ffffffffffffff58;
  ImVec2 IVar6;
  undefined4 in_stack_ffffffffffffff60;
  uint in_stack_ffffffffffffff64;
  byte bVar7;
  ImGuiDataType in_stack_ffffffffffffff6c;
  char *in_stack_ffffffffffffff70;
  char *in_stack_ffffffffffffff78;
  ImGuiButtonFlags in_stack_ffffffffffffffac;
  ImVec2 *size_arg;
  ImGuiContext *label_00;
  bool local_1;
  
  flags_00 = (ImGuiInputTextFlags)((ulong)in_stack_ffffffffffffff38 >> 0x20);
  pIVar3 = GetCurrentWindow();
  if ((pIVar3->SkipItems & 1U) == 0) {
    size_arg = (ImVec2 *)&GImGui->Style;
    label_00 = GImGui;
    if (in_R9 == 0) {
      DataTypeGetInfo(0);
    }
    DataTypeFormatString
              (in_stack_ffffffffffffff08,(int)in_stack_ffffffffffffff04,
               (ImGuiDataType)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,(char *)0x22a359);
    in_stack_ffffffffffffff64 = in_stack_ffffffffffffff64 & 0xffffff;
    if (in_RCX == (void *)0x0) {
      bVar1 = InputText((char *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                        in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,flags_00,
                        in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
      if (bVar1) {
        bVar1 = DataTypeApplyOpFromText
                          (in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
                           in_stack_ffffffffffffff6c,
                           (void *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                           in_stack_ffffffffffffff58);
        in_stack_ffffffffffffff64 = (uint)bVar1 << 0x18;
      }
    }
    else {
      _x = GetFrameHeight();
      BeginGroup();
      PushID(in_stack_ffffffffffffff10);
      fVar5 = CalcItemWidth();
      fVar2 = -(_x + size_arg[10].x);
      fVar2 = ImMax<float>(1.0,fVar2 + fVar2 + fVar5);
      SetNextItemWidth(fVar2);
      bVar1 = InputText((char *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                        in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,flags_00,
                        in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
      if (bVar1) {
        bVar1 = DataTypeApplyOpFromText
                          (in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
                           in_stack_ffffffffffffff6c,(void *)CONCAT44(in_stack_ffffffffffffff64,_x),
                           in_stack_ffffffffffffff58);
        in_stack_ffffffffffffff64 = (uint)bVar1 << 0x18;
      }
      IVar6 = size_arg[7];
      size_arg[7].x = size_arg[7].y;
      SameLine(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00);
      ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff4c,_x,_x);
      bVar1 = ButtonEx(&label_00->Initialized,size_arg,in_stack_ffffffffffffffac);
      if (bVar1) {
        if ((((label_00->IO).KeyCtrl & 1U) != 0) && (in_R8 != (void *)0x0)) {
          in_RCX = in_R8;
        }
        in_stack_ffffffffffffff24 = in_ESI;
        DataTypeApplyOp((ImGuiDataType)in_ESI,in_stack_ffffffffffffff20,in_RCX,
                        in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
        in_stack_ffffffffffffff64 = 0x1000000;
        in_stack_ffffffffffffff18 = in_RCX;
      }
      SameLine(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00);
      ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff44,_x,_x);
      bVar1 = ButtonEx(&label_00->Initialized,size_arg,in_stack_ffffffffffffffac);
      if (bVar1) {
        DataTypeApplyOp((ImGuiDataType)in_stack_ffffffffffffff24,in_stack_ffffffffffffff20,
                        in_stack_ffffffffffffff18,in_RDX,in_RDX);
        in_stack_ffffffffffffff64 = 0x1000000;
        in_stack_ffffffffffffff04 = in_ESI;
      }
      pcVar4 = FindRenderedTextEnd(in_RDI,(char *)0x0);
      if (in_RDI != pcVar4) {
        SameLine(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00);
        TextEx(in_stack_00000030,in_stack_00000028,in_stack_00000024);
      }
      size_arg[7] = IVar6;
      PopID();
      EndGroup();
    }
    bVar7 = (byte)(in_stack_ffffffffffffff64 >> 0x18);
    if ((in_stack_ffffffffffffff64 & 0x1000000) != 0) {
      MarkItemEdited((ImGuiID)in_stack_ffffffffffffff04);
    }
    local_1 = (bool)(bVar7 & 1);
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ImGui::InputScalar(const char* label, ImGuiDataType data_type, void* p_data, const void* p_step, const void* p_step_fast, const char* format, ImGuiInputTextFlags flags)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImGuiContext& g = *GImGui;
    ImGuiStyle& style = g.Style;

    if (format == NULL)
        format = DataTypeGetInfo(data_type)->PrintFmt;

    char buf[64];
    DataTypeFormatString(buf, IM_ARRAYSIZE(buf), data_type, p_data, format);

    bool value_changed = false;
    if ((flags & (ImGuiInputTextFlags_CharsHexadecimal | ImGuiInputTextFlags_CharsScientific)) == 0)
        flags |= ImGuiInputTextFlags_CharsDecimal;
    flags |= ImGuiInputTextFlags_AutoSelectAll;
    flags |= ImGuiInputTextFlags_NoMarkEdited;  // We call MarkItemEdited() ourselves by comparing the actual data rather than the string.

    if (p_step != NULL)
    {
        const float button_size = GetFrameHeight();

        BeginGroup(); // The only purpose of the group here is to allow the caller to query item data e.g. IsItemActive()
        PushID(label);
        SetNextItemWidth(ImMax(1.0f, CalcItemWidth() - (button_size + style.ItemInnerSpacing.x) * 2));
        if (InputText("", buf, IM_ARRAYSIZE(buf), flags)) // PushId(label) + "" gives us the expected ID from outside point of view
            value_changed = DataTypeApplyOpFromText(buf, g.InputTextState.InitialTextA.Data, data_type, p_data, format);

        // Step buttons
        const ImVec2 backup_frame_padding = style.FramePadding;
        style.FramePadding.x = style.FramePadding.y;
        ImGuiButtonFlags button_flags = ImGuiButtonFlags_Repeat | ImGuiButtonFlags_DontClosePopups;
        if (flags & ImGuiInputTextFlags_ReadOnly)
            button_flags |= ImGuiButtonFlags_Disabled;
        SameLine(0, style.ItemInnerSpacing.x);
        if (ButtonEx("-", ImVec2(button_size, button_size), button_flags))
        {
            DataTypeApplyOp(data_type, '-', p_data, p_data, g.IO.KeyCtrl && p_step_fast ? p_step_fast : p_step);
            value_changed = true;
        }
        SameLine(0, style.ItemInnerSpacing.x);
        if (ButtonEx("+", ImVec2(button_size, button_size), button_flags))
        {
            DataTypeApplyOp(data_type, '+', p_data, p_data, g.IO.KeyCtrl && p_step_fast ? p_step_fast : p_step);
            value_changed = true;
        }

        const char* label_end = FindRenderedTextEnd(label);
        if (label != label_end)
        {
            SameLine(0, style.ItemInnerSpacing.x);
            TextEx(label, label_end);
        }
        style.FramePadding = backup_frame_padding;

        PopID();
        EndGroup();
    }
    else
    {
        if (InputText(label, buf, IM_ARRAYSIZE(buf), flags))
            value_changed = DataTypeApplyOpFromText(buf, g.InputTextState.InitialTextA.Data, data_type, p_data, format);
    }
    if (value_changed)
        MarkItemEdited(window->DC.LastItemId);

    return value_changed;
}